

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

size_t lj_str_bufnum(char *s,cTValue *o)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = (o->field_2).it;
  if (uVar1 * 2 < 0xffe00000) {
    iVar2 = sprintf(s,"%.14g",o->u64);
    return (long)iVar2;
  }
  if ((uVar1 & 0xfffff) == 0 && (o->u32).lo == 0) {
    if ((int)uVar1 < 0) {
      builtin_strncpy(s,"-inf",4);
      return 4;
    }
    s[0] = 'i';
    s[1] = 'n';
    s[2] = 'f';
  }
  else {
    s[0] = 'n';
    s[1] = 'a';
    s[2] = 'n';
  }
  return 3;
}

Assistant:

size_t LJ_FASTCALL lj_str_bufnum(char *s, cTValue *o)
{
  if (LJ_LIKELY((o->u32.hi << 1) < 0xffe00000)) {  /* Finite? */
    lua_Number n = o->n;
#if __BIONIC__
    if (tvismzero(o)) { s[0] = '-'; s[1] = '0'; return 2; }
#endif
    return (size_t)lua_number2str(s, n);
  } else if (((o->u32.hi & 0x000fffff) | o->u32.lo) != 0) {
    s[0] = 'n'; s[1] = 'a'; s[2] = 'n'; return 3;
  } else if ((o->u32.hi & 0x80000000) == 0) {
    s[0] = 'i'; s[1] = 'n'; s[2] = 'f'; return 3;
  } else {
    s[0] = '-'; s[1] = 'i'; s[2] = 'n'; s[3] = 'f'; return 4;
  }
}